

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

void __thiscall google::protobuf::UnknownField::Delete(UnknownField *this)

{
  string *this_00;
  
  if (this->type_ == 4) {
    this_00 = (string *)(this->data_).group_;
    if (this_00 != (string *)0x0) {
      UnknownFieldSet::~UnknownFieldSet((UnknownFieldSet *)this_00);
    }
  }
  else {
    if (this->type_ != 3) {
      return;
    }
    this_00 = (string *)(this->data_).group_;
    if (this_00 != (string *)0x0) {
      std::__cxx11::string::~string(this_00);
    }
  }
  operator_delete(this_00);
  return;
}

Assistant:

const char* ParseGroup(uint32 num, const char* ptr, ParseContext* ctx) {
    UnknownFieldParserHelper child(unknown_->AddGroup(num));
    return ctx->ParseGroup(&child, ptr, num * 8 + 3);
  }